

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_collection.cpp
# Opt level: O2

void __thiscall
FImageCollection::Add(FImageCollection *this,char **patchNames,int numPatches,int namespc)

{
  uint uVar1;
  FTextureID FVar2;
  int lumpnum;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (this->ImageMap).Count;
  TArray<FTextureID,_FTextureID>::Resize(&this->ImageMap,numPatches + uVar1);
  uVar3 = 0;
  uVar4 = (ulong)(uint)numPatches;
  if (numPatches < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    FVar2 = FTextureManager::CheckForTexture(&TexMan,patchNames[uVar3],namespc,1);
    if ((FVar2.texnum < 1) &&
       (lumpnum = FWadCollection::CheckNumForName(&Wads,patchNames[uVar3],namespc), -1 < lumpnum)) {
      FVar2 = FTextureManager::CreateTexture(&TexMan,lumpnum,namespc);
    }
    (this->ImageMap).Array[(long)(int)uVar1 + uVar3].texnum = FVar2.texnum;
  }
  return;
}

Assistant:

void FImageCollection::Add (const char **patchNames, int numPatches, int namespc)
{
	int OldCount = ImageMap.Size();

	ImageMap.Resize(OldCount + numPatches);

	for (int i = 0; i < numPatches; ++i)
	{
		FTextureID picnum = TexMan.CheckForTexture(patchNames[i], namespc);
		if (!picnum.isValid())
		{
			int lumpnum = Wads.CheckNumForName(patchNames[i], namespc);
			if (lumpnum >= 0)
			{
				picnum = TexMan.CreateTexture(lumpnum, namespc);
			}
		}
		ImageMap[OldCount + i] = picnum;
	}
}